

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void create_new_bb_insns(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t after,MIR_insn_t insn_for_bb
                        )

{
  int iVar1;
  uint uVar2;
  bb_insn_t_conflict pbVar3;
  bb_insn_t_conflict pbVar4;
  DLIST_MIR_insn_t *pDVar5;
  MIR_insn_t pMVar6;
  bb_t_conflict bb;
  bool bVar7;
  
  if (insn_for_bb == (MIR_insn_t)0x0) {
    bb = (gen_ctx->curr_cfg->bbs).head;
    if (bb != (bb_t_conflict)0x0) {
      iVar1 = -1;
      do {
        bb = (bb->bb_link).next;
        if (bb == (bb_t)0x0) break;
        bVar7 = iVar1 != 0;
        iVar1 = iVar1 + 1;
      } while (bVar7);
    }
  }
  else {
    if (gen_ctx->optimize_level == 0) {
      uVar2 = *(int *)&insn_for_bb->field_0x18 - 0xa7;
      if ((uVar2 < 0xe) && ((0x2007U >> (uVar2 & 0x1f) & 1) != 0)) {
        insn_for_bb = (MIR_insn_t)insn_for_bb->data;
      }
    }
    else {
      insn_for_bb = (MIR_insn_t)((long)insn_for_bb->data + 0x30);
    }
    bb = (bb_t_conflict)insn_for_bb->data;
  }
  if (gen_ctx->optimize_level == 0) {
    if (before == (MIR_insn_t)0x0) {
      pDVar5 = &((gen_ctx->curr_func_item->u).func)->insns;
    }
    else {
      pDVar5 = (DLIST_MIR_insn_t *)&(before->insn_link).next;
    }
    for (pMVar6 = pDVar5->head; pMVar6 != after; pMVar6 = (pMVar6->insn_link).next) {
      setup_insn_data(gen_ctx,pMVar6,bb);
    }
  }
  else if ((before == (MIR_insn_t)0x0) || (((bb_insn_t_conflict)before->data)->bb != bb)) {
    if (after == (MIR_insn_t)0x0) {
      __assert_fail("after != ((void*)0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x295,"void create_new_bb_insns(gen_ctx_t, MIR_insn_t, MIR_insn_t, MIR_insn_t)"
                   );
    }
    if (before == (MIR_insn_t)0x0) {
      pDVar5 = &((gen_ctx->curr_func_item->u).func)->insns;
    }
    else {
      pDVar5 = (DLIST_MIR_insn_t *)&(before->insn_link).next;
    }
    pMVar6 = pDVar5->head;
    if (pMVar6 != after) {
      pbVar4 = (bb_insn_t_conflict)after->data;
      do {
        pbVar3 = create_bb_insn(gen_ctx,pMVar6,bb);
        if (bb == pbVar4->bb) {
          DLIST_bb_insn_t_insert_before(&bb->bb_insns,pbVar4,pbVar3);
        }
        else {
          DLIST_bb_insn_t_append(&bb->bb_insns,pbVar3);
        }
        pMVar6 = (pMVar6->insn_link).next;
      } while (pMVar6 != after);
    }
  }
  else {
    pMVar6 = (before->insn_link).next;
    if (pMVar6 != after) {
      pbVar4 = (bb_insn_t_conflict)before->data;
      do {
        pbVar3 = create_bb_insn(gen_ctx,pMVar6,bb);
        DLIST_bb_insn_t_insert_after(&bb->bb_insns,pbVar4,pbVar3);
        pMVar6 = (pMVar6->insn_link).next;
        pbVar4 = pbVar3;
      } while (pMVar6 != after);
    }
  }
  return;
}

Assistant:

static void create_new_bb_insns (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t after,
                                 MIR_insn_t insn_for_bb) {
  MIR_insn_t insn;
  bb_insn_t bb_insn, new_bb_insn;
  bb_t bb;

  /* Null insn_for_bb means it should be in the 1st block: skip entry and exit blocks: */
  bb = insn_for_bb == NULL ? DLIST_EL (bb_t, curr_cfg->bbs, 2) : get_insn_bb (gen_ctx, insn_for_bb);
  if (optimize_level == 0) {
    for (insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                                : DLIST_NEXT (MIR_insn_t, before));
         insn != after; insn = DLIST_NEXT (MIR_insn_t, insn))
      setup_insn_data (gen_ctx, insn, bb);
    return;
  }
  if (before != NULL && (bb_insn = before->data)->bb == bb) {
    for (insn = DLIST_NEXT (MIR_insn_t, before); insn != after;
         insn = DLIST_NEXT (MIR_insn_t, insn), bb_insn = new_bb_insn) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      DLIST_INSERT_AFTER (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
    }
  } else {
    gen_assert (after != NULL);
    bb_insn = after->data;
    insn = (before == NULL ? DLIST_HEAD (MIR_insn_t, curr_func_item->u.func->insns)
                           : DLIST_NEXT (MIR_insn_t, before));
    for (; insn != after; insn = DLIST_NEXT (MIR_insn_t, insn)) {
      new_bb_insn = create_bb_insn (gen_ctx, insn, bb);
      if (bb == bb_insn->bb)
        DLIST_INSERT_BEFORE (bb_insn_t, bb->bb_insns, bb_insn, new_bb_insn);
      else
        DLIST_APPEND (bb_insn_t, bb->bb_insns, new_bb_insn);
    }
  }
}